

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O2

dtime_tz_t __thiscall
duckdb::VectorTryCastErrorOperator<duckdb::TryCastErrorMessage>::
Operation<duckdb::string_t,duckdb::dtime_tz_t>
          (VectorTryCastErrorOperator<duckdb::TryCastErrorMessage> *this,string_t input,
          ValidityMask *mask,idx_t idx,void *dataptr)

{
  string *psVar1;
  string_t input_00;
  bool bVar2;
  PhysicalType type;
  string_t input_01;
  dtime_tz_t output;
  dtime_tz_t in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  input_01.value._8_8_ = input.value._0_8_;
  input_01.value._0_8_ = this;
  bVar2 = TryCastErrorMessage::Operation<duckdb::string_t,duckdb::dtime_tz_t>
                    (input_01,(dtime_tz_t *)&stack0xffffffffffffff28,*(CastParameters **)(idx + 8));
  if (!bVar2) {
    psVar1 = *(string **)(*(long *)(idx + 8) + 0x10);
    if ((psVar1 == (string *)0x0) || (*(long *)(psVar1 + 8) == 0)) {
      input_00.value.pointer.ptr = (char *)in_stack_ffffffffffffff28.bits;
      input_00.value._0_8_ = 0x754868;
      ConvertToString::Operation<duckdb::string_t>(input_00);
      ::std::operator+(&local_90,"Could not convert string \'",&local_50);
      ::std::operator+(&local_70,&local_90,"\' to ");
      TypeIdToString_abi_cxx11_(&local_b0,(duckdb *)0xff,type);
      ::std::operator+(&local_d0,&local_70,&local_b0);
      ::std::__cxx11::string::~string((string *)&local_b0);
      ::std::__cxx11::string::~string((string *)&local_70);
      ::std::__cxx11::string::~string((string *)&local_90);
      ::std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      ::std::__cxx11::string::string((string *)&local_d0,psVar1);
    }
    in_stack_ffffffffffffff28 =
         HandleVectorCastError::Operation<duckdb::dtime_tz_t>
                   (&local_d0,input.value._8_8_,(idx_t)mask,(VectorTryCastData *)idx);
    ::std::__cxx11::string::~string((string *)&local_d0);
  }
  return (dtime_tz_t)in_stack_ffffffffffffff28.bits;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output, data->parameters))) {
			return output;
		}
		bool has_error = data->parameters.error_message && !data->parameters.error_message->empty();
		return HandleVectorCastError::Operation<RESULT_TYPE>(
		    has_error ? *data->parameters.error_message : CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask, idx,
		    *data);
	}